

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void __thiscall FCommandBuffer::MakeStartPosGood(FCommandBuffer *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar6;
  int iVar5;
  
  uVar1 = this->StartPos;
  uVar4 = con_scale.Value;
  if (con_scale.Value < 1) {
    iVar5 = 2;
    if (2 < CleanXfac) {
      iVar5 = CleanXfac;
    }
    uVar4 = iVar5 - 1;
  }
  uVar2 = this->CursorPos;
  uVar6 = (uVar2 - ConCols / uVar4) + 2;
  uVar3 = uVar6;
  if (uVar1 < *(uint *)((this->Text).Chars + -0xc)) {
    uVar3 = uVar1;
  }
  if (ConCols / uVar4 - 2 <= uVar2 - uVar1) {
    uVar3 = uVar6;
  }
  if (uVar2 < uVar1) {
    uVar3 = uVar2;
  }
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  this->StartPos = uVar3;
  return;
}

Assistant:

void MakeStartPosGood()
	{
		int n = StartPos;
		unsigned cols = ConCols / active_con_scale();

		if (StartPos >= Text.Len())
		{ // Start of visible line is beyond end of line
			n = CursorPos - cols + 2;
		}
		if ((CursorPos - StartPos) >= cols - 2)
		{ // The cursor is beyond the visible part of the line
			n = CursorPos - cols + 2;
		}
		if (StartPos > CursorPos)
		{ // The cursor is in front of the visible part of the line
			n = CursorPos;
		}
		StartPos = MAX(0, n);
	}